

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandRead(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Io_FileType_t IVar3;
  size_t sVar4;
  char *pcVar5;
  Abc_Ntk_t *pAVar6;
  Gia_Man_t *pNew;
  void *pvVar7;
  char *pcVar8;
  Gia_Man_t *pGia;
  Abc_Ntk_t *pNtk_1;
  int fReadGia;
  int fBarBufs;
  int fCheck;
  int c;
  char *pTemp;
  char *pFileName;
  Abc_Ntk_t *pNtk;
  char Command [1000];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fReadGia = 1;
  pNtk_1._4_4_ = 0;
  bVar1 = false;
  glo_fMapped = 0;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"mcbgh"), iVar2 != -1) {
    switch(iVar2) {
    case 0x62:
      pNtk_1._4_4_ = pNtk_1._4_4_ ^ 1;
      break;
    case 99:
      fReadGia = fReadGia ^ 1;
      break;
    default:
      goto LAB_0039bb3e;
    case 0x67:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x68:
      goto LAB_0039bb3e;
    case 0x6d:
      glo_fMapped = glo_fMapped ^ 1;
    }
  }
  if (argc == globalUtilOptind + 1) {
    pcVar8 = argv[globalUtilOptind];
    for (_fCheck = pcVar8; *_fCheck != '\0'; _fCheck = _fCheck + 1) {
      if ((*_fCheck == '>') || (*_fCheck == '\\')) {
        *_fCheck = '/';
      }
    }
    pNtk._0_1_ = '\0';
    sVar4 = strlen(pcVar8);
    if (899 < sVar4) {
      __assert_fail("strlen(pFileName) < 900",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/io.c"
                    ,0xdd,"int IoCommandRead(Abc_Frame_t *, int, char **)");
    }
    pcVar5 = Extra_FileNameExtension(pcVar8);
    iVar2 = strcmp(pcVar5,"genlib");
    if (iVar2 == 0) {
      sprintf((char *)&pNtk,"read_genlib %s",pcVar8);
    }
    else {
      pcVar5 = Extra_FileNameExtension(pcVar8);
      iVar2 = strcmp(pcVar5,"lib");
      if (iVar2 == 0) {
        sprintf((char *)&pNtk,"read_lib %s",pcVar8);
      }
      else {
        pcVar5 = Extra_FileNameExtension(pcVar8);
        iVar2 = strcmp(pcVar5,"scl");
        if (iVar2 == 0) {
          sprintf((char *)&pNtk,"read_scl %s",pcVar8);
        }
        else {
          pcVar5 = Extra_FileNameExtension(pcVar8);
          iVar2 = strcmp(pcVar5,"super");
          if (iVar2 == 0) {
            sprintf((char *)&pNtk,"read_super %s",pcVar8);
          }
          else {
            pcVar5 = Extra_FileNameExtension(pcVar8);
            iVar2 = strcmp(pcVar5,"constr");
            if (iVar2 == 0) {
              sprintf((char *)&pNtk,"read_constr %s",pcVar8);
            }
            else {
              pcVar5 = Extra_FileNameExtension(pcVar8);
              iVar2 = strcmp(pcVar5,"c");
              if (iVar2 == 0) {
                sprintf((char *)&pNtk,"so %s",pcVar8);
              }
              else {
                pcVar5 = Extra_FileNameExtension(pcVar8);
                iVar2 = strcmp(pcVar5,"script");
                if (iVar2 == 0) {
                  sprintf((char *)&pNtk,"so %s",pcVar8);
                }
                else {
                  pcVar5 = Extra_FileNameExtension(pcVar8);
                  iVar2 = strcmp(pcVar5,"dsd");
                  if (iVar2 == 0) {
                    sprintf((char *)&pNtk,"dsd_load %s",pcVar8);
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((char)pNtk == '\0') {
      if (bVar1) {
        IVar3 = Io_ReadFileType(pcVar8);
        pAVar6 = Io_ReadNetlist(pcVar8,IVar3,fReadGia);
        if (pAVar6 != (Abc_Ntk_t *)0x0) {
          pNew = Abc_NtkFlattenHierarchyGia(pAVar6,(Vec_Ptr_t **)0x0,0);
          Abc_NtkDelete(pAVar6);
          if (pNew == (Gia_Man_t *)0x0) {
            Abc_Print(1,"Abc_CommandBlast(): Bit-blasting has failed.\n");
            return 0;
          }
          Abc_FrameUpdateGia(pAbc,pNew);
        }
        pAbc_local._4_4_ = 0;
      }
      else if ((glo_fMapped == 0) || (pvVar7 = Abc_FrameReadLibGen(), pvVar7 != (void *)0x0)) {
        IVar3 = Io_ReadFileType(pcVar8);
        pAVar6 = Io_Read(pcVar8,IVar3,fReadGia,pNtk_1._4_4_);
        if (pAVar6 == (Abc_Ntk_t *)0x0) {
          pAbc_local._4_4_ = 0;
        }
        else {
          iVar2 = Abc_NtkPiNum(pAVar6);
          if (iVar2 == 0) {
            Abc_Print(0,"The new network has no primary inputs. It is recommended\n");
            Abc_Print(1,"to add a dummy PI to make sure all commands work correctly.\n");
          }
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar6);
          Abc_FrameCopyLTLDataBase(pAbc,pAVar6);
          Abc_FrameClearVerifStatus(pAbc);
          pAbc_local._4_4_ = 0;
        }
      }
      else {
        Abc_Print(1,"Cannot read mapped design when the library is not given.\n");
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      Cmd_CommandExecute(pAbc,(char *)&pNtk);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
LAB_0039bb3e:
    fprintf((FILE *)pAbc->Err,"usage: read [-mcbgh] <file>\n");
    fprintf((FILE *)pAbc->Err,
            "\t         replaces the current network by the network read from <file>\n");
    fprintf((FILE *)pAbc->Err,
            "\t         by calling the parser that matches the extension of <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         (to read a hierarchical design, use \"read_hie\")\n");
    pcVar8 = "no";
    if (glo_fMapped != 0) {
      pcVar8 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-m     : toggle reading mapped Verilog [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (fReadGia != 0) {
      pcVar8 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",
            pcVar8);
    pcVar8 = "no";
    if (pNtk_1._4_4_ != 0) {
      pcVar8 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-b     : toggle reading barrier buffers [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (pNtk_1._4_4_ != 0) {
      pcVar8 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-g     : toggle reading and flattening into &-space [default = %s]\n",pcVar8);
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandRead( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Command[1000];
    Abc_Ntk_t * pNtk;
    char * pFileName, * pTemp;
    int c, fCheck, fBarBufs, fReadGia;

    fCheck = 1;
    fBarBufs = 0;
    fReadGia = 0;
    glo_fMapped = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mcbgh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'm':
                glo_fMapped ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'b':
                fBarBufs ^= 1;
                break;
            case 'g':
                fReadGia ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // fix the wrong symbol
    for ( pTemp = pFileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' || *pTemp == '\\' )
            *pTemp = '/';
    // read libraries
    Command[0] = 0;
    assert( strlen(pFileName) < 900 );
    if ( !strcmp( Extra_FileNameExtension(pFileName), "genlib" )  )
        sprintf( Command, "read_genlib %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "lib" ) )
        sprintf( Command, "read_lib %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "scl" ) )
        sprintf( Command, "read_scl %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "super" ) )
        sprintf( Command, "read_super %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "constr" ) )
        sprintf( Command, "read_constr %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "c" ) )
        sprintf( Command, "so %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "script" ) )
        sprintf( Command, "so %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "dsd" ) )
        sprintf( Command, "dsd_load %s", pFileName );
    if ( Command[0] )
    {
        Cmd_CommandExecute( pAbc, Command );
        return 0;
    }
    if ( fReadGia )
    {
        Abc_Ntk_t * pNtk = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), fCheck );
        if ( pNtk )
        {
            Gia_Man_t * pGia = Abc_NtkFlattenHierarchyGia( pNtk, NULL, 0 );
            Abc_NtkDelete( pNtk );
            if ( pGia == NULL )
            {
                Abc_Print( 1, "Abc_CommandBlast(): Bit-blasting has failed.\n" );
                return 0;
            }
            Abc_FrameUpdateGia( pAbc, pGia );
        }
        return 0;
    }
    // check if the library is available
    if ( glo_fMapped && Abc_FrameReadLibGen() == NULL )
    {
        Abc_Print( 1, "Cannot read mapped design when the library is not given.\n" );
        return 0;
    }
    // read the file using the corresponding file reader
    pNtk = Io_Read( pFileName, Io_ReadFileType(pFileName), fCheck, fBarBufs );
    if ( pNtk == NULL )
        return 0;
    if ( Abc_NtkPiNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The new network has no primary inputs. It is recommended\n" );
        Abc_Print( 1, "to add a dummy PI to make sure all commands work correctly.\n" );
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameCopyLTLDataBase( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read [-mcbgh] <file>\n" );
    fprintf( pAbc->Err, "\t         replaces the current network by the network read from <file>\n" );
    fprintf( pAbc->Err, "\t         by calling the parser that matches the extension of <file>\n" );
    fprintf( pAbc->Err, "\t         (to read a hierarchical design, use \"read_hie\")\n" );
    fprintf( pAbc->Err, "\t-m     : toggle reading mapped Verilog [default = %s]\n", glo_fMapped? "yes":"no" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-b     : toggle reading barrier buffers [default = %s]\n", fBarBufs? "yes":"no" );
    fprintf( pAbc->Err, "\t-g     : toggle reading and flattening into &-space [default = %s]\n", fBarBufs? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}